

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Int_t * Pdr_ManDeriveInfinityClauses(Pdr_Man_t *p,int fReduce)

{
  void *pvVar1;
  void **__ptr;
  int iVar2;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *p_00;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = Pdr_ManFindInvariantStart(p);
  vCubes = Pdr_ManCollectCubes(p,iVar2);
  if (fReduce != 0) {
    do {
      iVar2 = Pdr_ManDeriveMarkNonInductive(p,vCubes);
    } while (iVar2 != 0);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(4000);
  p_00->pArray = piVar3;
  Vec_IntPush(p_00,0);
  if (0 < vCubes->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = vCubes->pArray[lVar5];
      if (*(int *)((long)pvVar1 + 8) != -1) {
        if (p_00->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        *p_00->pArray = *p_00->pArray + 1;
        Vec_IntPush(p_00,*(int *)((long)pvVar1 + 0x10));
        if (0 < *(int *)((long)pvVar1 + 0x10)) {
          lVar4 = 0;
          do {
            Vec_IntPush(p_00,*(int *)((long)pvVar1 + lVar4 * 4 + 0x14));
            lVar4 = lVar4 + 1;
          } while (lVar4 < *(int *)((long)pvVar1 + 0x10));
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCubes->nSize);
  }
  if (p->vInfCubes != (Vec_Ptr_t *)0x0) {
    __ptr = p->vInfCubes->pArray;
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->vInfCubes->pArray = (void **)0x0;
    }
    if (p->vInfCubes != (Vec_Ptr_t *)0x0) {
      free(p->vInfCubes);
      p->vInfCubes = (Vec_Ptr_t *)0x0;
    }
  }
  p->vInfCubes = vCubes;
  Vec_IntPush(p_00,p->pAig->nRegs);
  return p_00;
}

Assistant:

Vec_Int_t * Pdr_ManDeriveInfinityClauses( Pdr_Man_t * p, int fReduce )
{
    Vec_Int_t * vResult;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, v, kStart;
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // refine as long as there are changes
    if ( fReduce )
        while ( Pdr_ManDeriveMarkNonInductive(p, vCubes) );
    // collect remaining clauses
    vResult = Vec_IntAlloc( 1000 );
    Vec_IntPush( vResult, 0 );
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 ) // skip non-inductive
            continue;
        Vec_IntAddToEntry( vResult, 0, 1 );
        Vec_IntPush( vResult, pCube->nLits );
        for ( v = 0; v < pCube->nLits; v++ )
            Vec_IntPush( vResult, pCube->Lits[v] );
    }
    //Vec_PtrFree( vCubes );
    Vec_PtrFreeP( &p->vInfCubes );
    p->vInfCubes = vCubes;
    Vec_IntPush( vResult, Aig_ManRegNum(p->pAig) );
    return vResult;
}